

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie.c
# Opt level: O0

void lm_trie_fix_counts(ngram_raw_t **raw_ngrams,uint32 *counts,uint32 *fixed_counts,int order)

{
  bool bVar1;
  priority_queue_t *queue;
  undefined8 *element;
  size_t sVar2;
  long *ptr;
  ulong uVar3;
  ngram_raw_t *pnVar4;
  uint local_90;
  int num;
  ngram_raw_t *top;
  int32 to_increment;
  ngram_raw_t *tmp_ngram;
  undefined8 uStack_68;
  int i;
  uint32 words [5];
  int aiStack_48 [2];
  uint32 raw_ngram_ptrs [4];
  priority_queue_t *ngrams;
  int order_local;
  uint32 *fixed_counts_local;
  uint32 *counts_local;
  ngram_raw_t **raw_ngrams_local;
  
  queue = priority_queue_create((long)(order + -1),ngram_ord_comparator);
  memset(&stack0xffffffffffffff98,0xff,0x14);
  memcpy(fixed_counts,counts,(long)order << 2);
  for (tmp_ngram._4_4_ = 2; (int)tmp_ngram._4_4_ <= order; tmp_ngram._4_4_ = tmp_ngram._4_4_ + 1) {
    if (counts[(int)(tmp_ngram._4_4_ + -1)] != 0) {
      raw_ngram_ptrs[(long)(int)(tmp_ngram._4_4_ + -2) + -2] = 0;
      element = (undefined8 *)
                __ckd_calloc__(1,0x18,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                               ,0xca);
      pnVar4 = raw_ngrams[(int)(tmp_ngram._4_4_ + -2)];
      *element = pnVar4->words;
      element[1] = *(undefined8 *)&pnVar4->prob;
      element[2] = *(undefined8 *)&pnVar4->order;
      *(uint *)(element + 2) = tmp_ngram._4_4_;
      priority_queue_add(queue,element);
    }
  }
  do {
    bVar1 = true;
    sVar2 = priority_queue_size(queue);
    if (sVar2 == 0) {
      sVar2 = priority_queue_size(queue);
      if (sVar2 != 0) {
        __assert_fail("priority_queue_size(ngrams) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                      ,0xf4,"void lm_trie_fix_counts(ngram_raw_t **, uint32 *, uint32 *, int)");
      }
      priority_queue_free(queue,(_func_void_void_ptr *)0x0);
      return;
    }
    ptr = (long *)priority_queue_poll(queue);
    if ((int)ptr[2] == 2) {
      uStack_68 = *(undefined8 *)*ptr;
    }
    else {
      for (tmp_ngram._4_4_ = 0; tmp_ngram._4_4_ < (int)ptr[2] - 1U;
          tmp_ngram._4_4_ = tmp_ngram._4_4_ + 1) {
        if (aiStack_48[(long)(int)tmp_ngram._4_4_ + -8] !=
            *(int *)(*ptr + (long)(int)tmp_ngram._4_4_ * 4)) {
          if (tmp_ngram._4_4_ == 0) {
            local_90 = 1;
          }
          else {
            local_90 = tmp_ngram._4_4_;
          }
          memcpy(&stack0xffffffffffffff98,(void *)*ptr,(long)(int)(local_90 + 1) << 2);
          fixed_counts[(int)local_90] = fixed_counts[(int)local_90] + 1;
          bVar1 = false;
          break;
        }
      }
      aiStack_48[(ulong)((int)ptr[2] - 1) - 8] = *(int *)(*ptr + (ulong)((int)ptr[2] - 1) * 4);
    }
    if (bVar1) {
      uVar3 = (ulong)((int)ptr[2] - 2);
      raw_ngram_ptrs[uVar3 - 2] = raw_ngram_ptrs[uVar3 - 2] + 1;
    }
    if (raw_ngram_ptrs[(ulong)((int)ptr[2] - 2) - 2] < counts[(int)ptr[2] - 1]) {
      pnVar4 = raw_ngrams[(int)ptr[2] - 2] + raw_ngram_ptrs[(ulong)((int)ptr[2] - 2) - 2];
      *ptr = (long)pnVar4->words;
      ptr[1] = *(long *)&pnVar4->prob;
      ptr[2] = *(long *)&pnVar4->order;
      priority_queue_add(queue,ptr);
    }
    else {
      ckd_free(ptr);
    }
  } while( true );
}

Assistant:

void
lm_trie_fix_counts(ngram_raw_t ** raw_ngrams, uint32 * counts,
                   uint32 * fixed_counts, int order)
{
    priority_queue_t *ngrams =
        priority_queue_create(order - 1, &ngram_ord_comparator);
    uint32 raw_ngram_ptrs[NGRAM_MAX_ORDER - 1];
    uint32 words[NGRAM_MAX_ORDER];
    int i;

    memset(words, -1, sizeof(words));
    memcpy(fixed_counts, counts, order * sizeof(*fixed_counts));
    for (i = 2; i <= order; i++) {
        ngram_raw_t *tmp_ngram;
        
        if (counts[i - 1] <= 0)
            continue;

        raw_ngram_ptrs[i - 2] = 0;

        tmp_ngram =
            (ngram_raw_t *) ckd_calloc(1, sizeof(*tmp_ngram));
        *tmp_ngram = raw_ngrams[i - 2][0];
        tmp_ngram->order = i;
        priority_queue_add(ngrams, tmp_ngram);
    }

    for (;;) {
        int32 to_increment = TRUE;
        ngram_raw_t *top;
        if (priority_queue_size(ngrams) == 0) {
            break;
        }
        top = (ngram_raw_t *) priority_queue_poll(ngrams);
        if (top->order == 2) {
            memcpy(words, top->words, 2 * sizeof(*words));
        }
        else {
            for (i = 0; (uint32)i < top->order - 1; i++) {
                if (words[i] != top->words[i]) {
                    int num;
                    num = (i == 0) ? 1 : i;
                    memcpy(words, top->words,
                           (num + 1) * sizeof(*words));
                    fixed_counts[num]++;
                    to_increment = FALSE;
                    break;
                }
            }
            words[top->order - 1] = top->words[top->order - 1];
        }
        if (to_increment) {
            raw_ngram_ptrs[top->order - 2]++;
        }
        if (raw_ngram_ptrs[top->order - 2] < counts[top->order - 1]) {
            *top = raw_ngrams[top->order - 2][raw_ngram_ptrs[top->order - 2]];
            priority_queue_add(ngrams, top);
        }
        else {
            ckd_free(top);
        }
    }

    assert(priority_queue_size(ngrams) == 0);
    priority_queue_free(ngrams, NULL);
}